

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_level_stats.cc
# Opt level: O2

Vp9Level __thiscall vp9_parser::Vp9LevelStats::GetLevel(Vp9LevelStats *this)

{
  Vp9Level VVar1;
  long lVar2;
  Vp9Level VVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int i_5;
  Vp9Level VVar7;
  int i;
  long *plVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  undefined1 *puVar12;
  double *pdVar13;
  double dVar14;
  
  lVar10 = this->max_luma_picture_size_;
  lVar2 = this->max_luma_picture_breadth_;
  lVar9 = this->max_luma_size_;
  dVar14 = GetAverageBitRate(this);
  plVar8 = (long *)(Vp9LevelTable + 8);
  VVar3 = LEVEL_UNKNOWN;
  for (lVar5 = 0; lVar5 != 0xe; lVar5 = lVar5 + 1) {
    if ((double)lVar9 <= (double)*plVar8 * (this->max_luma_sample_rate_grace_percent_ / 100.0 + 1.0)
       ) {
      VVar7 = *(Vp9Level *)(plVar8 + -1);
      VVar3 = VVar7;
      if ((int)VVar7 < 1) {
        VVar3 = LEVEL_UNKNOWN;
      }
      iVar4 = (int)lVar5;
      if ((int)VVar7 < 1) {
        iVar4 = 0;
      }
      goto LAB_00114dff;
    }
    plVar8 = plVar8 + 9;
  }
  iVar4 = 0;
LAB_00114dff:
  plVar8 = (long *)(Vp9LevelTable + 0x10);
  for (lVar9 = 0; VVar7 = VVar3, lVar9 != 0xe; lVar9 = lVar9 + 1) {
    if (lVar10 <= *plVar8) {
      VVar1 = *(Vp9Level *)(plVar8 + -2);
      VVar7 = VVar1;
      if ((int)VVar1 < (int)VVar3) {
        VVar7 = VVar3;
      }
      if ((int)VVar3 < (int)VVar1) {
        iVar4 = (int)lVar9;
      }
      break;
    }
    plVar8 = plVar8 + 9;
  }
  puVar12 = Vp9LevelTable;
  for (lVar10 = 0; VVar3 = VVar7, lVar10 != 0xe; lVar10 = lVar10 + 1) {
    if (lVar2 <= (long)*(undefined8 *)((long)puVar12 + 0x18)) {
      VVar1 = *(Vp9Level *)puVar12;
      VVar3 = VVar1;
      if ((int)VVar1 < (int)VVar7) {
        VVar3 = VVar7;
      }
      if ((int)VVar7 < (int)VVar1) {
        iVar4 = (int)lVar10;
      }
      break;
    }
    puVar12 = (undefined1 *)((long)puVar12 + 0x48);
  }
  pdVar13 = (double *)(Vp9LevelTable + 0x20);
  for (lVar10 = 0; VVar7 = VVar3, lVar10 != 0xe; lVar10 = lVar10 + 1) {
    if (dVar14 <= *pdVar13) {
      VVar1 = *(Vp9Level *)(pdVar13 + -4);
      VVar7 = VVar1;
      if ((int)VVar1 < (int)VVar3) {
        VVar7 = VVar3;
      }
      if ((int)VVar3 < (int)VVar1) {
        iVar4 = (int)lVar10;
      }
      break;
    }
    pdVar13 = pdVar13 + 9;
  }
  puVar12 = Vp9LevelTable;
  for (lVar10 = 0; VVar3 = VVar7, lVar10 != 0xe; lVar10 = lVar10 + 1) {
    if ((0.0 < *(double *)((long)puVar12 + 0x28)) &&
       ((double)this->max_cpb_size_ / 125.0 <= *(double *)((long)puVar12 + 0x28))) {
      VVar1 = *(Vp9Level *)puVar12;
      VVar3 = VVar1;
      if ((int)VVar1 < (int)VVar7) {
        VVar3 = VVar7;
      }
      if ((int)VVar7 < (int)VVar1) {
        iVar4 = (int)lVar10;
      }
      break;
    }
    puVar12 = (undefined1 *)((long)puVar12 + 0x48);
  }
  puVar12 = Vp9LevelTable;
  for (lVar10 = 0; VVar7 = VVar3, lVar10 != 0xe; lVar10 = lVar10 + 1) {
    if (this->max_column_tiles_ <= (int)*(Vp9Level *)((long)puVar12 + 0x38)) {
      VVar1 = *(Vp9Level *)puVar12;
      VVar7 = VVar1;
      if ((int)VVar1 < (int)VVar3) {
        VVar7 = VVar3;
      }
      if ((int)VVar3 < (int)VVar1) {
        iVar4 = (int)lVar10;
      }
      break;
    }
    puVar12 = (undefined1 *)((long)puVar12 + 0x48);
  }
  piVar11 = (int *)(Vp9LevelTable + 0x40);
  lVar10 = 0;
  do {
    VVar3 = VVar7;
    if (lVar10 == 0xe) {
LAB_00114f35:
      iVar6 = -1;
      if (this->minimum_altref_distance != 0x7fffffff) {
        iVar6 = this->minimum_altref_distance;
      }
      if (iVar6 < *(int *)(Vp9LevelTable + (long)iVar4 * 0x48 + 0x3c)) {
        VVar3 = LEVEL_UNKNOWN;
      }
      if ((double)this->total_uncompressed_bits_ / (double)(this->total_compressed_size_ << 3) <
          *(double *)(Vp9LevelTable + (long)iVar4 * 0x48 + 0x30)) {
        VVar3 = LEVEL_UNKNOWN;
      }
      return VVar3;
    }
    if (this->max_frames_refreshed_ <= *piVar11) {
      VVar1 = piVar11[-0x10];
      VVar3 = VVar1;
      if ((int)VVar1 < (int)VVar7) {
        VVar3 = VVar7;
      }
      if ((int)VVar7 < (int)VVar1) {
        iVar4 = (int)lVar10;
      }
      goto LAB_00114f35;
    }
    lVar10 = lVar10 + 1;
    piVar11 = piVar11 + 0x12;
  } while( true );
}

Assistant:

Vp9Level Vp9LevelStats::GetLevel() const {
  const int64_t max_luma_sample_rate = GetMaxLumaSampleRate();
  const int64_t max_luma_picture_size = GetMaxLumaPictureSize();
  const int64_t max_luma_picture_breadth = GetMaxLumaPictureBreadth();
  const double average_bitrate = GetAverageBitRate();
  const double max_cpb_size = GetMaxCpbSize();
  const double compression_ratio = GetCompressionRatio();
  const int max_column_tiles = GetMaxColumnTiles();
  const int min_altref_distance = GetMinimumAltrefDistance();
  const int max_ref_frames = GetMaxReferenceFrames();

  int level_index = 0;
  Vp9Level max_level = LEVEL_UNKNOWN;
  const double grace_multiplier =
      max_luma_sample_rate_grace_percent_ / 100.0 + 1.0;
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_sample_rate <=
        Vp9LevelTable[i].max_luma_sample_rate * grace_multiplier) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_picture_size <= Vp9LevelTable[i].max_luma_picture_size) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_picture_breadth <= Vp9LevelTable[i].max_luma_picture_breadth) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (average_bitrate <= Vp9LevelTable[i].average_bitrate) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    // Only check CPB size for levels that are defined.
    if (Vp9LevelTable[i].max_cpb_size > 0 &&
        max_cpb_size <= Vp9LevelTable[i].max_cpb_size) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_column_tiles <= Vp9LevelTable[i].max_tiles) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }

  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_ref_frames <= Vp9LevelTable[i].max_ref_frames) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }

  // Check if the current level meets the minimum altref distance requirement.
  // If not, set to unknown level as we can't move up a level as the minimum
  // altref distance get farther apart and we can't move down a level as we are
  // already at the minimum level for all the other requirements.
  if (min_altref_distance < Vp9LevelTable[level_index].min_altref_distance)
    max_level = LEVEL_UNKNOWN;

  // The minimum compression ratio has the same behavior as minimum altref
  // distance.
  if (compression_ratio < Vp9LevelTable[level_index].compression_ratio)
    max_level = LEVEL_UNKNOWN;
  return max_level;
}